

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void pxa270c0_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xf);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),1);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),2);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x69054114;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0xd172172;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0x78;
  return;
}

Assistant:

static void pxa270c0_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V5);
    set_feature(&cpu->env, ARM_FEATURE_XSCALE);
    set_feature(&cpu->env, ARM_FEATURE_IWMMXT);
    cpu->midr = 0x69054114;
    cpu->ctr = 0xd172172;
    cpu->reset_sctlr = 0x00000078;
}